

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmp_test.cpp
# Opt level: O1

void __thiscall diff_match_patch_test::testDiffCommonPrefix(diff_match_patch_test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *paVar1;
  int iVar2;
  diff_match_patch_test *pdVar3;
  long *local_80 [2];
  long local_70 [2];
  long *local_60 [2];
  long local_50 [2];
  wstring local_40;
  
  paVar1 = &local_40.field_2;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&local_40,L"diff_commonPrefix: Null case.",L"");
  local_60[0] = local_50;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_60,L"abc",L"");
  local_80[0] = local_70;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_80,L"xyz",L"");
  pdVar3 = this;
  iVar2 = diff_match_patch::diff_commonPrefix((wstring *)this,(wstring *)local_60);
  assertEquals(pdVar3,&local_40,0,iVar2);
  if (local_80[0] != local_70) {
    operator_delete(local_80[0],local_70[0] * 4 + 4);
  }
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],local_50[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity * 4 + 4);
  }
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&local_40,L"diff_commonPrefix: Non-null case.",L"");
  local_60[0] = local_50;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_60,L"1234abcdef",L"");
  local_80[0] = local_70;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_80,L"1234xyz",L"");
  pdVar3 = this;
  iVar2 = diff_match_patch::diff_commonPrefix((wstring *)this,(wstring *)local_60);
  assertEquals(pdVar3,&local_40,4,iVar2);
  if (local_80[0] != local_70) {
    operator_delete(local_80[0],local_70[0] * 4 + 4);
  }
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],local_50[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity * 4 + 4);
  }
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&local_40,L"diff_commonPrefix: Whole case.",L"");
  local_60[0] = local_50;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_60,L"1234",L"");
  local_80[0] = local_70;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_80,L"1234xyz",L"");
  iVar2 = diff_match_patch::diff_commonPrefix((wstring *)this,(wstring *)local_60);
  assertEquals(this,&local_40,4,iVar2);
  if (local_80[0] != local_70) {
    operator_delete(local_80[0],local_70[0] * 4 + 4);
  }
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],local_50[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity * 4 + 4);
  }
  return;
}

Assistant:

void diff_match_patch_test::testDiffCommonPrefix() {
  // Detect any common prefix.
  assertEquals(L"diff_commonPrefix: Null case.", 0, dmp.diff_commonPrefix(L"abc", L"xyz"));

  assertEquals(L"diff_commonPrefix: Non-null case.", 4, dmp.diff_commonPrefix(L"1234abcdef", L"1234xyz"));

  assertEquals(L"diff_commonPrefix: Whole case.", 4, dmp.diff_commonPrefix(L"1234", L"1234xyz"));
}